

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O0

void printSolutions(vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *solutions,
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *grid)

{
  bool bVar1;
  int iVar2;
  ostream *this;
  reference ppsVar3;
  reference this_00;
  reference pvVar4;
  value_type local_40;
  int answer;
  int c;
  int r;
  int coverRow;
  s_DancingNode **local_28;
  __normal_iterator<s_DancingNode_**,_std::vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>_>
  local_20;
  iterator i;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *grid_local;
  vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *solutions_local;
  
  i._M_current = (s_DancingNode **)grid;
  this = std::operator<<((ostream *)&std::cout,"\nPrinting Solution: \n");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  __gnu_cxx::
  __normal_iterator<s_DancingNode_**,_std::vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>_>
  ::__normal_iterator(&local_20);
  local_28 = (s_DancingNode **)
             std::vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>::begin(solutions);
  local_20._M_current = local_28;
  while( true ) {
    _r = std::vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>::end(solutions);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<s_DancingNode_**,_std::vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>_>
                        *)&r);
    if (!bVar1) break;
    ppsVar3 = __gnu_cxx::
              __normal_iterator<s_DancingNode_**,_std::vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>_>
              ::operator*(&local_20);
    iVar2 = (*ppsVar3)->row + -1;
    local_40 = iVar2 % 9 + 1;
    if (local_40 == 0) {
      local_40 = 9;
    }
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)i._M_current,(long)(iVar2 / 0x51));
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (this_00,(long)(int)((long)((ulong)(uint)((int)((long)iVar2 / 9) >> 0x1f) <<
                                                   0x20 | (long)iVar2 / 9 & 0xffffffffU) % 9));
    *pvVar4 = local_40;
    __gnu_cxx::
    __normal_iterator<s_DancingNode_**,_std::vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>_>
    ::operator++(&local_20,0);
  }
  return;
}

Assistant:

void printSolutions(vector<DancingNode*> &solutions, vector<vector<int>> &grid) 
{ 
    
    cout<<"\nPrinting Solution: \n"<< endl;
    vector<DancingNode*>::iterator i; 
  
    for(i = solutions.begin(); i!=solutions.end(); i++){
        //cout<<(*i)->row<<endl;
        int coverRow = (*i)->row - 1;
        int r = coverRow / 81 ;
        int c = (coverRow / 9 ) % 9;
        int answer = (coverRow % 9) + 1;
        if(answer == 0){
            answer = 9;
        }
        
        grid[r][c] = answer;
    }
}